

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void bag_explode(CHAR_DATA *ch,OBJ_DATA *obj,int everyone)

{
  void *pvVar1;
  int in_EDX;
  char *in_RSI;
  void *in_RDI;
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  CHAR_DATA *in_stack_000037b8;
  CHAR_DATA *in_stack_000037c0;
  void *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  void *arg1;
  undefined4 in_stack_ffffffffffffffe8;
  
  act(in_RSI,(CHAR_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
      in_stack_ffffffffffffffd8,0);
  act(in_RSI,(CHAR_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
      in_stack_ffffffffffffffd8,0);
  if (in_EDX == 3) {
    act(in_RSI,(CHAR_DATA *)CONCAT44(3,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
        in_stack_ffffffffffffffd8,0);
    send_to_char(in_RSI,(CHAR_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    unequip_char(ch,obj,everyone._3_1_);
    extract_obj((OBJ_DATA *)vch_next);
    raw_kill(in_stack_000037c0,in_stack_000037b8);
  }
  else if ((in_EDX == 2) || (in_EDX == 1)) {
    pvVar1 = *(void **)(*(long *)((long)in_RDI + 0xa8) + 0x18);
    while (arg1 = pvVar1, arg1 != (void *)0x0) {
      in_stack_ffffffffffffffd8 = *(void **)((long)arg1 + 8);
      pvVar1 = in_stack_ffffffffffffffd8;
      if (arg1 != in_RDI) {
        act(in_RSI,(CHAR_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),arg1,
            in_stack_ffffffffffffffd8,0);
        send_to_char(in_RSI,(CHAR_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
        raw_kill(in_stack_000037c0,in_stack_000037b8);
        pvVar1 = in_stack_ffffffffffffffd8;
      }
    }
    if (in_EDX != 2) {
      unequip_char(ch,obj,everyone._3_1_);
      extract_obj((OBJ_DATA *)vch_next);
      act(in_RSI,(CHAR_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),arg1,
          in_stack_ffffffffffffffd8,0);
      send_to_char(in_RSI,(CHAR_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
      raw_kill(in_stack_000037c0,in_stack_000037b8);
    }
  }
  return;
}

Assistant:

void bag_explode(CHAR_DATA *ch, OBJ_DATA *obj, int everyone)
{

	CHAR_DATA *vch;
	CHAR_DATA *vch_next;

	act("\x01B[1;31mA small bag of explosives detonates in a blinding flash of light!\x01B[0;37m", ch, obj, 0, TO_ROOM);
	act("\x01B[1;31mA small bag of explosives detonates in a blinding flash of light!\x01B[0;37m", ch, obj, 0, TO_CHAR);

	if (everyone == 3)
	{
		act("$n EXPLODES in an eruption of blood and fluids!", ch, 0, 0, TO_ROOM);
		send_to_char("You have EXPLODED!!\n\r", ch);
		unequip_char(ch, obj, true);
		extract_obj(obj);
		raw_kill(ch, ch);
	}
	else if (everyone == 2 || everyone == 1)
	{
		for (vch = ch->in_room->people; vch; vch = vch_next)
		{
			vch_next = vch->next_in_room;
			if (vch == ch)
				continue;

			act("$n EXPLODES in an eruption of blood and fluids!", vch, 0, 0, TO_ROOM);
			send_to_char("You have EXPLODED!!\n\r", vch);
			raw_kill(ch, vch);
		}

		if (everyone == 2)
			return;

		unequip_char(ch, obj, true);
		extract_obj(obj);
		act("$n EXPLODES in an eruption of blood and fluids!", ch, 0, 0, TO_ROOM);
		send_to_char("You have EXPLODED!!\n\r", ch);
		raw_kill(ch, ch);
	}
}